

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

Mesh * Assimp::Ogre::OgreBinarySerializer::ImportMesh(MemoryStreamReader *stream)

{
  MemoryStreamReader *this;
  unsigned_short uVar1;
  int iVar2;
  Mesh *this_00;
  runtime_error *prVar3;
  OgreBinarySerializer serializer;
  string version;
  OgreBinarySerializer local_1f0;
  string local_1d8;
  string local_1b8 [32];
  undefined1 *local_198 [2];
  undefined1 local_188 [360];
  
  local_1f0.m_currentLen = 0;
  local_1f0.assetMode = AM_Mesh;
  local_1f0.m_reader = stream;
  uVar1 = StreamReader<false,_false>::Get<unsigned_short>(stream);
  if (uVar1 != 0x1000) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Invalid Ogre Mesh file header.","");
    std::runtime_error::runtime_error(prVar3,(string *)local_198);
    *(undefined ***)prVar3 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ReadLine_abi_cxx11_(&local_1d8,&local_1f0);
  if (local_1d8._M_string_length == DAT_009030c0) {
    if (local_1d8._M_string_length != 0) {
      iVar2 = bcmp(local_1d8._M_dataplus._M_p,MESH_VERSION_1_8_abi_cxx11_,local_1d8._M_string_length
                  );
      if (iVar2 != 0) goto LAB_004b69e1;
    }
    this_00 = (Mesh *)operator_new(0x80);
    Mesh::Mesh(this_00);
    if (*(int *)&(local_1f0.m_reader)->end != *(int *)&(local_1f0.m_reader)->current) {
      do {
        this = local_1f0.m_reader;
        uVar1 = StreamReader<false,_false>::Get<unsigned_short>(local_1f0.m_reader);
        local_1f0.m_currentLen = StreamReader<false,_false>::Get<unsigned_int>(this);
        if (uVar1 == 0x3000) {
          ReadMesh(&local_1f0,this_00);
        }
      } while (*(int *)&(local_1f0.m_reader)->end != *(int *)&(local_1f0.m_reader)->current);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    return this_00;
  }
LAB_004b69e1:
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Mesh version ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             " not supported by this importer. Run OgreMeshUpgrader tool on the file and try again."
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198," Supported versions: ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,MESH_VERSION_1_8_abi_cxx11_,DAT_009030c0);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,local_1b8);
  *(undefined ***)prVar3 = &PTR__runtime_error_0082bce0;
  __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Mesh *OgreBinarySerializer::ImportMesh(MemoryStreamReader *stream)
{
    OgreBinarySerializer serializer(stream, OgreBinarySerializer::AM_Mesh);

    uint16_t id = serializer.ReadHeader(false);
    if (id != HEADER_CHUNK_ID) {
        throw DeadlyExportError("Invalid Ogre Mesh file header.");
    }

    /// @todo Check what we can actually support.
    std::string version = serializer.ReadLine();
    if (version != MESH_VERSION_1_8)
    {
        throw DeadlyExportError(Formatter::format() << "Mesh version " << version << " not supported by this importer. Run OgreMeshUpgrader tool on the file and try again."
            << " Supported versions: " << MESH_VERSION_1_8);
    }

    Mesh *mesh = new Mesh();
    while (!serializer.AtEnd())
    {
        id = serializer.ReadHeader();
        switch(id)
        {
            case M_MESH:
            {
                serializer.ReadMesh(mesh);
                break;
            }
        }
    }
    return mesh;
}